

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountingStorageItemRegister.hpp
# Opt level: O0

int __thiscall
supermap::
CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>
::clone(CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  pointer pSVar1;
  pointer in_stack_ffffffffffffffa8;
  int iVar2;
  CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>
  *__u;
  undefined1 local_20 [16];
  __fn *local_10;
  CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>
  *local_8;
  
  __u = this;
  local_10 = __fn;
  local_8 = this;
  operator_new(0x18);
  pSVar1 = std::
           unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_void>_>_>
           ::operator->((unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_void>_>_>
                         *)0x15ef3e);
  (**(pSVar1->
     super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_void>_>
     )._vptr_Cloneable)(local_20);
  CountingStorageItemRegister
            ((CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>
              *)__fn,(char)((ulong)__u >> 0x38),
             (unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_void>_>_>
              *)this);
  std::
  unique_ptr<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,char,void>,std::default_delete<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,char,void>>>
  ::
  unique_ptr<std::default_delete<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,char,void>>,void>
            ((unique_ptr<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>,_std::default_delete<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>_>_>
              *)this,in_stack_ffffffffffffffa8);
  std::
  unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,supermap::CountingStorageInfo<char,void>>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,supermap::CountingStorageInfo<char,void>>>>
  ::
  unique_ptr<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,char,void>,std::default_delete<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,char,void>>,void>
            ((unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_supermap::CountingStorageInfo<char,_void>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_supermap::CountingStorageInfo<char,_void>_>_>_>
              *)__fn,(unique_ptr<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>,_std::default_delete<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>_>_>
                      *)__u);
  iVar2 = (int)__u;
  std::
  unique_ptr<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>,_std::default_delete<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>_>_>
  ::~unique_ptr((unique_ptr<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>,_std::default_delete<supermap::CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>_>_>
                 *)this);
  std::
  unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_void>_>_>
  ::~unique_ptr((unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_void>_>_>
                 *)this);
  return iVar2;
}

Assistant:

std::unique_ptr<StorageItemRegister<T, CountingStorageInfo<IndexT, AdditionalInfo>>>
    clone() const override {
        return std::unique_ptr<CountingStorageItemRegister<T, IndexT, AdditionalInfo>>(
            new CountingStorageItemRegister(count_,
                                            innerRegister_->clone())
        );
    }